

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode Curl_readrewind(connectdata *conn)

{
  Curl_easy *data_00;
  uint uVar1;
  curlioerr cVar2;
  int iVar3;
  curlioerr err_1;
  int err;
  Curl_easy *data;
  connectdata *conn_local;
  
  data_00 = conn->data;
  (conn->bits).rewindaftersend = false;
  (data_00->req).keepon = (data_00->req).keepon & 0xfffffffd;
  if (((data_00->set).postfields == (void *)0x0) && ((data_00->set).httpreq != HTTPREQ_POST_FORM)) {
    if ((data_00->set).seek_func == (curl_seek_callback)0x0) {
      if ((data_00->set).ioctl_func == (curl_ioctl_callback)0x0) {
        if (((data_00->state).fread_func == fread) &&
           (iVar3 = fseek((FILE *)(data_00->state).in,0,0), iVar3 != -1)) {
          return CURLE_OK;
        }
        Curl_failf(data_00,"necessary data rewind wasn\'t possible");
        return CURLE_SEND_FAIL_REWIND;
      }
      cVar2 = (*(data_00->set).ioctl_func)(data_00,1,(data_00->set).ioctl_client);
      Curl_infof(data_00,"the ioctl callback returned %d\n",(ulong)cVar2);
      if (cVar2 != CURLIOE_OK) {
        Curl_failf(data_00,"ioctl callback returned error %d",(ulong)cVar2);
        return CURLE_SEND_FAIL_REWIND;
      }
    }
    else {
      uVar1 = (*(data_00->set).seek_func)((data_00->set).seek_client,0,0);
      if (uVar1 != 0) {
        Curl_failf(data_00,"seek callback returned error %d",(ulong)uVar1);
        return CURLE_SEND_FAIL_REWIND;
      }
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_readrewind(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;

  conn->bits.rewindaftersend = FALSE; /* we rewind now */

  /* explicitly switch off sending data on this connection now since we are
     about to restart a new transfer and thus we want to avoid inadvertently
     sending more data on the existing connection until the next transfer
     starts */
  data->req.keepon &= ~KEEP_SEND;

  /* We have sent away data. If not using CURLOPT_POSTFIELDS or
     CURLOPT_HTTPPOST, call app to rewind
  */
  if(data->set.postfields ||
     (data->set.httpreq == HTTPREQ_POST_FORM))
    ; /* do nothing */
  else {
    if(data->set.seek_func) {
      int err;

      err = (data->set.seek_func)(data->set.seek_client, 0, SEEK_SET);
      if(err) {
        failf(data, "seek callback returned error %d", (int)err);
        return CURLE_SEND_FAIL_REWIND;
      }
    }
    else if(data->set.ioctl_func) {
      curlioerr err;

      err = (data->set.ioctl_func)(data, CURLIOCMD_RESTARTREAD,
                                   data->set.ioctl_client);
      infof(data, "the ioctl callback returned %d\n", (int)err);

      if(err) {
        /* FIXME: convert to a human readable error message */
        failf(data, "ioctl callback returned error %d", (int)err);
        return CURLE_SEND_FAIL_REWIND;
      }
    }
    else {
      /* If no CURLOPT_READFUNCTION is used, we know that we operate on a
         given FILE * stream and we can actually attempt to rewind that
         ourselves with fseek() */
      if(data->state.fread_func == (curl_read_callback)fread) {
        if(-1 != fseek(data->state.in, 0, SEEK_SET))
          /* successful rewind */
          return CURLE_OK;
      }

      /* no callback set or failure above, makes us fail at once */
      failf(data, "necessary data rewind wasn't possible");
      return CURLE_SEND_FAIL_REWIND;
    }
  }
  return CURLE_OK;
}